

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCacheCommand.cxx
# Opt level: O3

bool __thiscall
cmLoadCacheCommand::ReadWithPrefix
          (cmLoadCacheCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char cVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  string *psVar5;
  string *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  string *psVar7;
  string *psVar8;
  string cacheFile;
  string line;
  ifstream fin;
  char buffer [4096];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12a0;
  long *local_1280 [2];
  long local_1270 [2];
  char *local_1260;
  char *local_1258;
  char local_1250;
  undefined7 uStack_124f;
  long local_1240;
  long local_1238;
  byte abStack_1220 [488];
  string local_1038 [128];
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x41) {
    local_1038[0]._M_dataplus._M_p = (pointer)&local_1038[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1038,"READ_WITH_PREFIX form must specify a prefix.","");
    cmCommand::SetError(&this->super_cmCommand,local_1038);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
      operator_delete(local_1038[0]._M_dataplus._M_p,local_1038[0].field_2._M_allocated_capacity + 1
                     );
    }
    bVar4 = false;
  }
  else {
    local_12a0._M_dataplus._M_p = (pointer)&local_12a0.field_2;
    pcVar3 = (pbVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_12a0,pcVar3,pcVar3 + pbVar2->_M_string_length);
    std::__cxx11::string::append((char *)&local_12a0);
    bVar4 = cmsys::SystemTools::FileExists(local_12a0._M_dataplus._M_p);
    if (bVar4) {
      std::__cxx11::string::_M_assign((string *)&this->Prefix);
      this_00 = &this->VariablesToRead;
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      __v = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 3;
      local_1038[0]._M_dataplus._M_p = (pointer)this_00;
      if (__v != pbVar2) {
        do {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::
          _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this_00,
                     (const_iterator)&(this->VariablesToRead)._M_t._M_impl.super__Rb_tree_header,__v
                     ,(_Alloc_node *)local_1038);
          __v = __v + 1;
        } while (__v != pbVar2);
      }
      std::ifstream::ifstream(&local_1240,local_12a0._M_dataplus._M_p,_S_in);
      local_1260 = &local_1250;
      local_1258 = (char *)0x0;
      local_1250 = '\0';
      if ((abStack_1220[*(long *)(local_1240 + -0x18)] & 5) == 0) {
        do {
          std::istream::read((char *)&local_1240,(long)local_1038);
          if (local_1238 != 0) {
            psVar5 = (string *)((long)&local_1038[0]._M_dataplus._M_p + local_1238);
            psVar6 = local_1038;
            psVar7 = psVar6;
LAB_00322869:
            do {
              cVar1 = *(char *)&(psVar7->_M_dataplus)._M_p;
              psVar8 = psVar7;
              if (cVar1 != '\n') {
                psVar7 = (string *)((long)&(psVar7->_M_dataplus)._M_p + 1);
                psVar8 = psVar5;
                if (psVar7 != psVar5) goto LAB_00322869;
              }
              local_1280[0] = local_1270;
              if ((psVar8 == psVar6) || (psVar8[-1].field_2._M_local_buf[0xf] != '\r')) {
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1280,psVar6,psVar8);
                std::__cxx11::string::_M_append((char *)&local_1260,(ulong)local_1280[0]);
              }
              else {
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1280,psVar6,
                           (undefined1 *)((long)&psVar8[-1].field_2 + 0xf));
                std::__cxx11::string::_M_append((char *)&local_1260,(ulong)local_1280[0]);
              }
              if (local_1280[0] != local_1270) {
                operator_delete(local_1280[0],local_1270[0] + 1);
              }
              psVar6 = psVar8;
              if (cVar1 == '\n') {
                CheckLine(this,local_1260);
                std::__cxx11::string::_M_replace((ulong)&local_1260,0,local_1258,0x50ff0f);
                psVar6 = (string *)((long)&(psVar8->_M_dataplus)._M_p + 1);
              }
              psVar7 = psVar6;
            } while (psVar6 != psVar5);
          }
        } while ((abStack_1220[*(long *)(local_1240 + -0x18)] & 5) == 0);
        if (local_1258 != (char *)0x0) {
          CheckLine(this,local_1260);
        }
        if (local_1260 != &local_1250) {
          operator_delete(local_1260,CONCAT71(uStack_124f,local_1250) + 1);
        }
      }
      std::ifstream::~ifstream(&local_1240);
    }
    else {
      std::operator+(local_1038,"Cannot load cache file from ",&local_12a0);
      cmCommand::SetError(&this->super_cmCommand,local_1038);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
        operator_delete(local_1038[0]._M_dataplus._M_p,
                        local_1038[0].field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_12a0._M_dataplus._M_p != &local_12a0.field_2) {
      operator_delete(local_12a0._M_dataplus._M_p,local_12a0.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar4;
}

Assistant:

bool cmLoadCacheCommand::ReadWithPrefix(std::vector<std::string> const& args)
{
  // Make sure we have a prefix.
  if(args.size() < 3)
    {
    this->SetError("READ_WITH_PREFIX form must specify a prefix.");
    return false;
    }

  // Make sure the cache file exists.
  std::string cacheFile = args[0]+"/CMakeCache.txt";
  if(!cmSystemTools::FileExists(cacheFile.c_str()))
    {
    std::string e = "Cannot load cache file from " + cacheFile;
    this->SetError(e);
    return false;
    }

  // Prepare the table of variables to read.
  this->Prefix = args[2];
  this->VariablesToRead.insert(args.begin() + 3, args.end());

  // Read the cache file.
  cmsys::ifstream fin(cacheFile.c_str());

  // This is a big hack read loop to overcome a buggy ifstream
  // implementation on HP-UX.  This should work on all platforms even
  // for small buffer sizes.
  const int bufferSize = 4096;
  char buffer[bufferSize];
  std::string line;
  while(fin)
    {
    // Read a block of the file.
    fin.read(buffer, bufferSize);
    if(fin.gcount())
      {
      // Parse for newlines directly.
      const char* i = buffer;
      const char* end = buffer+fin.gcount();
      while(i != end)
        {
        const char* begin = i;
        while(i != end && *i != '\n') { ++i; }
        if(i == begin || *(i-1) != '\r')
          {
          // Include this portion of the line.
          line += std::string(begin, i-begin);
          }
        else
          {
          // Include this portion of the line.
          // Don't include the \r in a \r\n pair.
          line += std::string(begin, i-1-begin);
          }
        if(i != end)
          {
          // Completed a line.
          this->CheckLine(line.c_str());
          line = "";

          // Skip the newline character.
          ++i;
          }
        }
      }
    }
  if(!line.empty())
    {
    // Partial last line.
    this->CheckLine(line.c_str());
    }

  return true;
}